

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildInt(int base,string_view t_val,bool prefixed)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Alloc_hider __nptr;
  int *piVar6;
  pointer pcVar7;
  undefined7 in_register_00000009;
  char *pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int __base;
  char *pcVar10;
  undefined4 in_register_0000003c;
  element_type *this;
  byte in_R8B;
  int iVar11;
  Boxed_Value BVar12;
  undefined1 auVar13 [12];
  string local_70;
  int local_4c;
  long local_48;
  char *local_40;
  pointer local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  this = (element_type *)CONCAT44(in_register_0000003c,base);
  pcVar8 = t_val._M_str;
  __base = (int)t_val._M_len;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  pcVar10 = pcVar8;
  do {
    if (pcVar10 == (char *)0x0) break;
    if ((pcVar10[CONCAT71(in_register_00000009,prefixed) + -1] & 0xdfU) == 0x55) {
      bVar1 = true;
      bVar2 = true;
    }
    else if ((pcVar10[CONCAT71(in_register_00000009,prefixed) + -1] & 0xdfU) == 0x4c) {
      bVar4 = bVar5;
      if (bVar3) {
        bVar4 = true;
      }
      bVar1 = true;
      bVar3 = true;
      bVar5 = bVar4;
    }
    else {
      bVar1 = false;
    }
    pcVar10 = pcVar10 + -1;
  } while (bVar1);
  local_40 = pcVar8 + -2;
  if (in_R8B == 0) {
    local_40 = pcVar8;
  }
  local_48 = CONCAT71(in_register_00000009,prefixed) + (ulong)in_R8B * 2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_40 = local_40 + local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_48,local_40);
  __nptr._M_p = local_70._M_dataplus._M_p;
  piVar6 = __errno_location();
  local_4c = *piVar6;
  *piVar6 = 0;
  pcVar7 = (pointer)strtoll(__nptr._M_p,&local_38,__base);
  if (local_38 == __nptr._M_p) {
    auVar13 = std::__throw_invalid_argument("stoll");
    if (auVar13._8_4_ != 1) {
      _Unwind_Resume(auVar13._0_8_);
    }
    __cxa_begin_catch(auVar13._0_8_);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_48,local_40);
    pcVar7 = (pointer)std::__cxx11::stoull(&local_70,(size_t *)0x0,__base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = pcVar7;
    if (bVar4) {
      detail::const_var_impl<unsigned_long_long>((detail *)this,(unsigned_long_long *)&local_70);
    }
    else {
      detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_70);
    }
    __cxa_end_catch();
    _Var9._M_pi = extraout_RDX;
    goto LAB_0036f92f;
  }
  if (*piVar6 == 0) {
LAB_0036f82d:
    *piVar6 = local_4c;
  }
  else if (*piVar6 == 0x22) {
    std::__throw_out_of_range("stoll");
    goto LAB_0036f82d;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar11 = (int)pcVar7;
  if ((bVar2) || ((pointer)(long)iVar11 != pcVar7 || bVar3)) {
    if (((__base != 10 | bVar2) == 0xff && !bVar3) && (ulong)pcVar7 >> 0x20 == 0) {
      local_70._M_dataplus._M_p._0_4_ = iVar11;
      BVar12 = detail::const_var_impl<unsigned_int>((detail *)this,(uint *)&local_70);
      _Var9._M_pi = BVar12.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    else {
      local_70._M_dataplus._M_p = pcVar7;
      if ((bVar2) || (bVar4)) {
        if ((__base == 10 && !bVar2) || (bVar4)) {
          if (bVar2) {
            BVar12 = detail::const_var_impl<unsigned_long_long>
                               ((detail *)this,(unsigned_long_long *)&local_70);
            _Var9._M_pi = BVar12.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
          }
          else {
            BVar12 = detail::const_var_impl<long_long>((detail *)this,(longlong *)&local_70);
            _Var9._M_pi = BVar12.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
          }
        }
        else {
          BVar12 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_70);
          _Var9._M_pi = BVar12.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
      else {
        BVar12 = detail::const_var_impl<long>((detail *)this,(long *)&local_70);
        _Var9._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
  }
  else {
    local_70._M_dataplus._M_p._0_4_ = iVar11;
    BVar12 = detail::const_var_impl<int>((detail *)this,(int *)&local_70);
    _Var9._M_pi = BVar12.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_0036f92f:
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, std::string_view t_val, const bool prefixed) {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          const char val = t_val[i - 1];

          if (val == 'u' || val == 'U') {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_) {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        if (prefixed) {
          t_val.remove_prefix(2);
        }

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#pragma GCC diagnostic ignored "-Wtautological-unsigned-zero-compare"
#pragma GCC diagnostic ignored "-Wtautological-type-limit-compare"
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif

#endif

        try {
          /// TODO fix this to use from_chars
          auto u = std::stoll(std::string(t_val), nullptr, base);

          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min()
                     && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min()
                     && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            /// TODO fix this to use from_chars
            auto u = std::stoull(std::string(t_val), nullptr, base);

            if (!longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }